

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManSaveValue(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = p->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < iVar1) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      Vec_IntPush(p_00,*(int *)(&p->pObjs->field_0x0 + lVar5));
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar4 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSaveValue( Gia_Man_t * p )
{
    Vec_Int_t * vValues;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    return vValues;
}